

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::save(Dictionary *this,ostream *out)

{
  bool bVar1;
  reference pvVar2;
  entry *in_RSI;
  long in_RDI;
  value_type pair;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *__range1;
  entry e;
  int32_t i;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff48;
  entry *in_stack_ffffffffffffff50;
  entry *in_stack_ffffffffffffff58;
  entry *in_stack_ffffffffffffff60;
  value_type local_90;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_88;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_80;
  long local_78;
  entry local_60;
  int local_14;
  entry *local_10;
  
  local_10 = in_RSI;
  std::ostream::write((char *)in_RSI,in_RDI + 0x58);
  std::ostream::write((char *)local_10,in_RDI + 0x5c);
  std::ostream::write((char *)local_10,in_RDI + 0x60);
  std::ostream::write((char *)local_10,in_RDI + 0x68);
  std::ostream::write((char *)local_10,in_RDI + 0x70);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x58); local_14 = local_14 + 1) {
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::operator[]
              ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28),
               (long)local_14);
    in_stack_ffffffffffffff50 = &local_60;
    entry::entry(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 = local_10;
    in_stack_ffffffffffffff60 = (entry *)std::__cxx11::string::data();
    std::__cxx11::string::size();
    std::ostream::write((char *)in_stack_ffffffffffffff58,(long)in_stack_ffffffffffffff60);
    std::ostream::put((char)local_10);
    std::ostream::write((char *)local_10,(long)&local_60.count);
    std::ostream::write((char *)local_10,(long)&local_60.type);
    entry::~entry(in_stack_ffffffffffffff50);
  }
  local_78 = in_RDI + 0x78;
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
       ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    pvVar2 = std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                       ((_Node_const_iterator<std::pair<const_int,_int>,_false,_false> *)0x1a6aa6);
    local_90 = *pvVar2;
    std::ostream::write((char *)local_10,(long)&local_90);
    std::ostream::write((char *)local_10,(long)&local_90.second);
    std::__detail::_Node_const_iterator<std::pair<const_int,_int>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_int,_int>,_false,_false> *)
               in_stack_ffffffffffffff50);
  }
  return;
}

Assistant:

void Dictionary::save(std::ostream& out) const {
  out.write((char*)&size_, sizeof(int32_t));
  out.write((char*)&nwords_, sizeof(int32_t));
  out.write((char*)&nlabels_, sizeof(int32_t));
  out.write((char*)&ntokens_, sizeof(int64_t));
  out.write((char*)&pruneidx_size_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    entry e = words_[i];
    out.write(e.word.data(), e.word.size() * sizeof(char));
    out.put(0);
    out.write((char*)&(e.count), sizeof(int64_t));
    out.write((char*)&(e.type), sizeof(entry_type));
  }
  for (const auto pair : pruneidx_) {
    out.write((char*)&(pair.first), sizeof(int32_t));
    out.write((char*)&(pair.second), sizeof(int32_t));
  }
}